

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msatActivity.c
# Opt level: O0

void Msat_SolverClaBumpActivity(Msat_Solver_t *p,Msat_Clause_t *pC)

{
  float local_1c;
  float Activ;
  Msat_Clause_t *pC_local;
  Msat_Solver_t *p_local;
  
  local_1c = Msat_ClauseReadActivity(pC);
  if (1e+20 < (double)local_1c + p->dClaInc) {
    Msat_SolverClaRescaleActivity(p);
    local_1c = Msat_ClauseReadActivity(pC);
  }
  Msat_ClauseWriteActivity(pC,local_1c + (float)p->dClaInc);
  return;
}

Assistant:

void Msat_SolverClaBumpActivity( Msat_Solver_t * p, Msat_Clause_t * pC )
{
    float Activ;
    Activ = Msat_ClauseReadActivity(pC);
    if ( Activ + p->dClaInc > 1e20 )
    {
        Msat_SolverClaRescaleActivity( p );
        Activ = Msat_ClauseReadActivity( pC );
    }
    Msat_ClauseWriteActivity( pC, Activ + (float)p->dClaInc );
}